

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::Parameters::Parameters(Parameters *this,Dim *d,float scale)

{
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *pvVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  AlignedMemoryPool<6U> *pAVar6;
  uint uVar7;
  float *pfVar8;
  undefined1 auVar9 [16];
  
  (this->super_ParametersBase)._vptr_ParametersBase = (_func_int **)&PTR_scale_parameters_002e5858;
  uVar2 = *(undefined8 *)(d->d + 2);
  uVar3 = *(undefined8 *)(d->d + 4);
  uVar4 = *(undefined8 *)(d->d + 6);
  *(undefined8 *)(this->dim).d = *(undefined8 *)d->d;
  *(undefined8 *)((this->dim).d + 2) = uVar2;
  *(undefined8 *)((this->dim).d + 4) = uVar3;
  *(undefined8 *)((this->dim).d + 6) = uVar4;
  auVar9 = ZEXT816(0) << 0x20;
  (this->dim).bd = d->bd;
  (this->values).d.nd = 0;
  (this->values).d.bd = 1;
  pvVar1 = &(this->values).bs;
  (pvVar1->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar9._0_8_;
  (pvVar1->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar9._8_8_;
  (this->values).bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->g).d.nd = 0;
  (this->g).d.bd = 1;
  pvVar1 = &(this->g).bs;
  (pvVar1->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar9._0_8_;
  (pvVar1->super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar9._8_8_;
  (this->g).bs.super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar2 = *(undefined8 *)(d->d + 2);
  uVar3 = *(undefined8 *)(d->d + 4);
  uVar4 = *(undefined8 *)(d->d + 6);
  *(undefined8 *)(this->g).d.d = *(undefined8 *)d->d;
  *(undefined8 *)((this->g).d.d + 2) = uVar2;
  *(undefined8 *)((this->g).d.d + 4) = uVar3;
  *(undefined8 *)((this->g).d.d + 6) = uVar4;
  (this->g).d.bd = d->bd;
  uVar2 = *(undefined8 *)d->d;
  uVar3 = *(undefined8 *)(d->d + 2);
  uVar4 = *(undefined8 *)(d->d + 4);
  uVar5 = *(undefined8 *)(d->d + 6);
  (this->values).d.bd = d->bd;
  *(undefined8 *)(this->values).d.d = uVar2;
  *(undefined8 *)((this->values).d.d + 2) = uVar3;
  *(undefined8 *)((this->values).d.d + 4) = uVar4;
  *(undefined8 *)((this->values).d.d + 6) = uVar5;
  pAVar6 = ps;
  uVar7 = Dim::size(d);
  pfVar8 = (float *)AlignedMemoryPool<6U>::allocate(pAVar6,(ulong)uVar7 << 2);
  (this->values).v = pfVar8;
  if (scale == 0.0) {
    TensorTools::Randomize(&this->values);
  }
  else {
    TensorTools::Randomize(&this->values,scale);
  }
  pAVar6 = ps;
  uVar7 = Dim::size(d);
  pfVar8 = (float *)AlignedMemoryPool<6U>::allocate(pAVar6,(ulong)uVar7 << 2);
  (this->g).v = pfVar8;
  TensorTools::Zero(&this->g);
  return;
}

Assistant:

Parameters::Parameters(const Dim& d, float scale) : dim(d) {
  values.d = g.d = d;
  values.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
  if (scale) {
    TensorTools::Randomize(values, scale);
  }
  else {
    TensorTools::Randomize(values);
  }
  g.v = static_cast<float*>(ps->allocate(d.size() * sizeof(float)));
  TensorTools::Zero(g);
}